

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,Script *script,string_view source_filename,
                 string_view module_filename_noext,WriteBinaryOptions *options,
                 vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                 *out_module_streams,Stream *log_stream)

{
  Result RVar1;
  function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)> local_118;
  undefined1 local_f8 [8];
  BinaryWriterSpec binary_writer_spec;
  undefined1 local_60 [8];
  WriteBinarySpecStreamFactory module_stream_factory;
  Script *script_local;
  Stream *json_stream_local;
  string_view module_filename_noext_local;
  string_view source_filename_local;
  
  binary_writer_spec.num_modules_ = (size_t)&out_module_streams;
  module_stream_factory._M_invoker = (_Invoker_type)script;
  std::function<wabt::Stream*(std::basic_string_view<char,std::char_traits<char>>)>::
  function<wabt::WriteBinarySpecScript(wabt::Stream*,wabt::Script*,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,wabt::WriteBinaryOptions_const&,std::vector<wabt::FilenameMemoryStreamPair,std::allocator<wabt::FilenameMemoryStreamPair>>*,wabt::Stream*)::__0,void>
            ((function<wabt::Stream*(std::basic_string_view<char,std::char_traits<char>>)> *)
             local_60,(anon_class_16_2_e828f163 *)&binary_writer_spec.num_modules_);
  std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::function
            (&local_118,
             (function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)> *)
             local_60);
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            ((BinaryWriterSpec *)local_f8,json_stream,&local_118,source_filename,
             module_filename_noext,options);
  std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            (&local_118);
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript
                    ((BinaryWriterSpec *)local_f8,(Script *)module_stream_factory._M_invoker);
  anon_unknown_1::BinaryWriterSpec::~BinaryWriterSpec((BinaryWriterSpec *)local_f8);
  std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)> *)
             local_60);
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(
    Stream* json_stream,
    Script* script,
    std::string_view source_filename,
    std::string_view module_filename_noext,
    const WriteBinaryOptions& options,
    std::vector<FilenameMemoryStreamPair>* out_module_streams,
    Stream* log_stream) {
  WriteBinarySpecStreamFactory module_stream_factory =
      [&](std::string_view filename) {
        out_module_streams->emplace_back(
            filename, std::make_unique<MemoryStream>(log_stream));
        return out_module_streams->back().stream.get();
      };

  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}